

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O1

void __thiscall ImVector<unsigned_short>::resize(ImVector<unsigned_short> *this,int new_size)

{
  int iVar1;
  unsigned_short *__dest;
  int iVar2;
  
  iVar1 = this->Capacity;
  if (iVar1 < new_size) {
    if (iVar1 == 0) {
      iVar2 = 8;
    }
    else {
      iVar2 = iVar1 / 2 + iVar1;
    }
    if (iVar2 <= new_size) {
      iVar2 = new_size;
    }
    if (iVar1 < iVar2) {
      __dest = (unsigned_short *)ImGui::MemAlloc((long)iVar2 * 2);
      if (this->Data != (unsigned_short *)0x0) {
        memcpy(__dest,this->Data,(long)this->Size * 2);
        ImGui::MemFree(this->Data);
      }
      this->Data = __dest;
      this->Capacity = iVar2;
    }
  }
  this->Size = new_size;
  return;
}

Assistant:

inline void         resize(int new_size)                { if (new_size > Capacity) reserve(_grow_capacity(new_size)); Size = new_size; }